

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
SmallArray<CompilerStatistics::Timer,_16U>::SmallArray
          (SmallArray<CompilerStatistics::Timer,_16U> *this,Allocator *allocator)

{
  Timer *local_20;
  Allocator *allocator_local;
  SmallArray<CompilerStatistics::Timer,_16U> *this_local;
  
  local_20 = this->little;
  do {
    CompilerStatistics::Timer::Timer(local_20);
    local_20 = local_20 + 1;
  } while (local_20 != (Timer *)&this->allocator);
  this->allocator = allocator;
  this->data = this->little;
  this->max = 0x10;
  this->count = 0;
  return;
}

Assistant:

SmallArray(Allocator *allocator = 0): allocator(allocator)
	{
		data = little;
		max = N;

		count = 0;
	}